

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O2

void __thiscall ExampleAppConsole::~ExampleAppConsole(ExampleAppConsole *this)

{
  int i;
  long lVar1;
  
  ClearLog(this);
  for (lVar1 = 0; lVar1 < (this->History).Size; lVar1 = lVar1 + 1) {
    free((this->History).Data[lVar1]);
  }
  ImVector<ImGuiTextFilter::ImGuiTextRange>::~ImVector(&(this->Filter).Filters);
  ImVector<char_*>::~ImVector(&this->History);
  ImVector<const_char_*>::~ImVector(&this->Commands);
  ImVector<char_*>::~ImVector(&this->Items);
  return;
}

Assistant:

~ExampleAppConsole()
    {
        ClearLog();
        for (int i = 0; i < History.Size; i++)
            free(History[i]);
    }